

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

bool __thiscall
vkt::texture::SampleVerifier::verifySampleImpl
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,ostream *report)

{
  float fVar1;
  ImgDim IVar2;
  undefined1 auVar3 [16];
  float afVar4 [4];
  Vec4 VVar5;
  bool bVar6;
  uint uVar7;
  float *pfVar8;
  uint faceNdx;
  bool bVar9;
  Vec4 coord;
  Vec2 dPdyFace;
  Vec2 dPdxFace;
  Vec2 coordFace;
  Vec4 dPdy;
  Vec4 dPdx;
  int in_stack_fffffffffffffef8;
  Vec2 *dPdyFace_00;
  Vec4 local_f8;
  ostream *local_e0;
  Vec4 *local_d8;
  Vec2 local_d0;
  Vec2 local_c8;
  Vec2 local_c0;
  Vec4 local_b8;
  Vec4 local_a8;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  float local_60 [2];
  float afStack_58 [2];
  float local_50 [2];
  float afStack_48 [2];
  float local_40 [2];
  float afStack_38 [2];
  
  afVar4 = *&(args->coord).m_data;
  local_f8.m_data[0] = afVar4[0];
  local_f8.m_data[1] = afVar4[1];
  local_f8.m_data[2] = afVar4[2];
  local_f8.m_data[3] = afVar4[3];
  IVar2 = this->m_imParams->dim;
  if (IVar2 - IMG_DIM_3D < 2) {
    pfVar8 = local_f8.m_data + 3;
  }
  else if (IVar2 == IMG_DIM_1D) {
    pfVar8 = local_f8.m_data + 1;
  }
  else if (IVar2 == IMG_DIM_2D) {
    pfVar8 = local_f8.m_data + 2;
  }
  else {
    pfVar8 = local_f8.m_data;
  }
  if (this->m_sampleLookupSettings->isProjective == true) {
    fVar1 = *pfVar8;
    auVar3._4_4_ = fVar1;
    auVar3._0_4_ = fVar1;
    auVar3._8_4_ = fVar1;
    auVar3._12_4_ = fVar1;
    local_f8.m_data = (float  [4])divps(afVar4,auVar3);
  }
  VVar5.m_data = local_f8.m_data;
  if (this->m_sampleLookupSettings->lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) {
    local_a8.m_data._0_8_ = *(undefined8 *)(args->dPdx).m_data;
    local_a8.m_data._8_8_ = *(undefined8 *)((args->dPdx).m_data + 2);
    local_b8.m_data[0] = (args->dPdy).m_data[0];
    local_b8.m_data[1] = (args->dPdy).m_data[1];
    local_b8.m_data[2] = (args->dPdy).m_data[2];
    local_b8.m_data[3] = (args->dPdy).m_data[3];
  }
  else {
    local_b8.m_data[0] = 0.0;
    local_b8.m_data[1] = 0.0;
    local_b8.m_data[2] = 0.0;
    local_b8.m_data[3] = 0.0;
    local_a8.m_data[0] = 0.0;
    local_a8.m_data[1] = 0.0;
    local_a8.m_data[2] = 0.0;
    local_a8.m_data[3] = 0.0;
  }
  local_e0 = report;
  local_d8 = result;
  if (IVar2 == IMG_DIM_CUBE) {
    local_70.m_data[0] = local_f8.m_data[0];
    local_70.m_data[1] = local_f8.m_data[1];
    local_70.m_data[2] = local_f8.m_data[2];
    local_80.m_data[0] = local_a8.m_data[0];
    local_80.m_data[1] = local_a8.m_data[1];
    local_80.m_data[2] = local_a8.m_data[2];
    local_90.m_data[1] = local_b8.m_data[1];
    local_90.m_data[0] = local_b8.m_data[0];
    local_f8.m_data = VVar5.m_data;
    local_90.m_data[2] = local_b8.m_data[2];
    uVar7 = util::calcCandidateCubemapFaces(&local_70);
    bVar9 = true;
    faceNdx = 0;
    do {
      if ((uVar7 >> (faceNdx & 0x1f) & 1) != 0) {
        local_c0.m_data[0] = 0.0;
        local_c0.m_data[1] = 0.0;
        local_c8.m_data[0] = 0.0;
        local_c8.m_data[1] = 0.0;
        local_d0.m_data[0] = 0.0;
        local_d0.m_data[1] = 0.0;
        dPdyFace_00 = &local_d0;
        util::calcCubemapFaceCoords
                  (&local_70,&local_80,&local_90,faceNdx,&local_c0,&local_c8,dPdyFace_00);
        local_40[0] = local_c0.m_data[0];
        local_40[1] = local_c0.m_data[1];
        afStack_38[0] = 0.0;
        afStack_38[1] = 0.0;
        local_50[0] = local_c8.m_data[0];
        local_50[1] = local_c8.m_data[1];
        afStack_48[0] = 0.0;
        afStack_48[1] = 0.0;
        local_60[0] = local_d0.m_data[0];
        local_60[1] = local_d0.m_data[1];
        afStack_58[0] = 0.0;
        afStack_58[1] = 0.0;
        bVar6 = verifySampleCubemapFace
                          (this,args,local_d8,(Vec4 *)local_40,(Vec4 *)local_50,(Vec4 *)local_60,
                           (int)dPdyFace_00,local_e0);
        if (bVar6) {
          return bVar9;
        }
      }
      bVar9 = faceNdx < 5;
      faceNdx = faceNdx + 1;
    } while (faceNdx != 6);
  }
  else {
    bVar9 = verifySampleCubemapFace
                      (this,args,result,&local_f8,&local_a8,&local_b8,in_stack_fffffffffffffef8,
                       report);
  }
  return bVar9;
}

Assistant:

bool SampleVerifier::verifySampleImpl (const SampleArguments&	args,
									   const Vec4&				result,
									   std::ostream&			report) const
{
	// \todo [2016-07-11 collinbaker] Handle depth and stencil formats
	// \todo [2016-07-06 collinbaker] Handle dRef
	DE_ASSERT(m_samplerParams.isCompare == false);

	Vec4	coord	  = args.coord;
	int coordSize = 0;

	if (m_imParams.dim == IMG_DIM_1D)
	{
		coordSize = 1;
	}
	else if (m_imParams.dim == IMG_DIM_2D)
	{
		coordSize = 2;
	}
	else if (m_imParams.dim == IMG_DIM_3D || m_imParams.dim == IMG_DIM_CUBE)
	{
		coordSize = 3;
	}

	// 15.6.1 Project operation

	if (m_sampleLookupSettings.isProjective)
	{
		DE_ASSERT(args.coord[coordSize] != 0.0f);
		const float proj = coord[coordSize];

		coord = coord / proj;
	}

	const Vec4 dPdx = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdx : Vec4(0);
	const Vec4 dPdy = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdy : Vec4(0);

	// 15.6.3 Cube Map Face Selection and Transformations

	if (m_imParams.dim == IMG_DIM_CUBE)
	{
		const Vec3	r		   = coord.swizzle(0, 1, 2);
		const Vec3	drdx	   = dPdx.swizzle(0, 1, 2);
		const Vec3	drdy	   = dPdy.swizzle(0, 1, 2);

	    int			faceBitmap = calcCandidateCubemapFaces(r);

		// We must test every possible disambiguation order

		for (int faceNdx = 0; faceNdx < 6; ++faceNdx)
		{
			const bool isPossible = ((faceBitmap & (1U << faceNdx)) != 0);

		    if (!isPossible)
			{
				continue;
			}

			Vec2 coordFace;
			Vec2 dPdxFace;
			Vec2 dPdyFace;

			calcCubemapFaceCoords(r, drdx, drdy, faceNdx, coordFace, dPdxFace, dPdyFace);

			if (verifySampleCubemapFace(args,
										result,
										Vec4(coordFace[0], coordFace[1], 0.0f, 0.0f),
										Vec4(dPdxFace[0], dPdxFace[1], 0.0f, 0.0f),
										Vec4(dPdyFace[0], dPdyFace[1], 0.0f, 0.0f),
										faceNdx,
										report))
			{
				return true;
			}
		}

		return false;
	}
	else
	{
		return verifySampleCubemapFace(args, result, coord, dPdx, dPdy, 0, report);
	}
}